

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intdiv.cpp
# Opt level: O0

void bitmanip::(anonymous_namespace)::
     test_intdiv_manual_norem_impl<unsigned_int,(bitmanip::Rounding)0,(bitmanip::Rounding)1>(void)

{
  uint max;
  uint min;
  
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_1,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_1,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<1,_1,_1>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_1,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<1,_1,_1>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<2,_1,_2>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<3,_1,_3>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_2,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<2,_2,_1>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<4,_2,_2>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<8,_2,_4>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<16,_2,_8>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<32,_2,_16>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<64,_2,_32>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_7,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<7,_7,_1>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<14,_7,_2>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<21,_7,_3>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<28,_7,_4>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<35,_7,_5>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_4294967295U,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0,_0U,_0>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<4294967295U,_1,_4294967295U>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0U,_1,_0U>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<4294967295U,_4294967295U,_1>();
  anon_unknown_0::test_intdiv_tester<unsigned_int,_(bitmanip::Rounding)0,_(bitmanip::Rounding)1>::
  run<0U,_0U,_1>();
  return;
}

Assistant:

void test_intdiv_manual_norem_impl()
{
    using tester = test_intdiv_tester<T, Round, TieBreak>;

    // trivial cases
    tester::template run<0, 1, 0>();
    tester::template run<0, 1, 0>();
    tester::template run<1, 1, 1>();

    // division by one
    tester::template run<0, 1, 0>();
    tester::template run<1, 1, 1>();
    tester::template run<2, 1, 2>();
    tester::template run<3, 1, 3>();

    // division by 2
    tester::template run<0, 2, 0>();
    tester::template run<2, 2, 1>();
    tester::template run<4, 2, 2>();
    tester::template run<8, 2, 4>();
    tester::template run<16, 2, 8>();
    tester::template run<32, 2, 16>();
    tester::template run<64, 2, 32>();

    // division by seven
    tester::template run<0, 7, 0>();
    tester::template run<7, 7, 1>();
    tester::template run<14, 7, 2>();
    tester::template run<21, 7, 3>();
    tester::template run<28, 7, 4>();
    tester::template run<35, 7, 5>();

    constexpr T min = std::numeric_limits<T>::min();
    constexpr T max = std::numeric_limits<T>::max();

    tester::template run<0, max, 0>();
    tester::template run<0, min, 0>();

    tester::template run<max, 1, max>();
    tester::template run<min, 1, min>();

    tester::template run<max, max, 1>();
    tester::template run<min, min, 1>();
}